

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

void __thiscall
absl::lts_20240722::cord_internal::InlineData::set_inline_data(InlineData *this,char *data,size_t n)

{
  anon_class_1_0_00000001 local_19;
  
  if (0xf < n) {
    set_inline_data::anon_class_1_0_00000001::operator()(&local_19);
  }
  (this->rep_).field_0.data[0] = (char)n * '\x02';
  SmallMemmove<true>((this->rep_).field_0.data + 1,data,n);
  return;
}

Assistant:

void set_inline_data(const char* data, size_t n) {
    ABSL_ASSERT(n <= kMaxInline);
    unpoison();
    rep_.set_tag(static_cast<int8_t>(n << 1));
    SmallMemmove<true>(rep_.as_chars(), data, n);
    poison();
  }